

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

void __thiscall Rml::Element::Blur(Element *this)

{
  Context *this_00;
  Element *pEVar1;
  Context *context;
  Element *this_local;
  
  if ((this->parent != (Element *)0x0) && (this_00 = GetContext(this), this_00 != (Context *)0x0)) {
    pEVar1 = Context::GetFocusElement(this_00);
    if (pEVar1 == this) {
      Focus(this->parent,false);
    }
    else if (this->parent->focus == this) {
      this->parent->focus = (Element *)0x0;
    }
  }
  return;
}

Assistant:

void Element::Blur()
{
	if (parent)
	{
		Context* context = GetContext();
		if (context == nullptr)
			return;

		if (context->GetFocusElement() == this)
		{
			parent->Focus();
		}
		else if (parent->focus == this)
		{
			parent->focus = nullptr;
		}
	}
}